

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

int AMPLSetOption<char_const*>(AMPLS_MP_Solver *slv,char *name,char *v)

{
  SolverOption *pSVar1;
  OptionError *o;
  runtime_error *e;
  exception *anon_var_0;
  SolverOption *opt;
  BasicBackend *be;
  char *in_stack_fffffffffffffef8;
  BasicStringRef<char> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff48;
  SolverOptionManager *in_stack_ffffffffffffff50;
  undefined8 local_50;
  undefined8 local_48;
  
  AMPLSGetBackend((AMPLS_MP_Solver *)0x4f7eac);
  pSVar1 = mp::SolverOptionManager::GetOption(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  (*pSVar1->_vptr_SolverOption[9])(pSVar1,local_50,local_48);
  return 0;
}

Assistant:

int AMPLSetOption(AMPLS_MP_Solver* slv,
  const char* name, T v) {
  auto be = AMPLSGetBackend(slv);
  try {
    auto opt = be->GetOption(name);
    opt->SetValue(v);
    return 0;
  }
  catch (const mp::OptionError& o) {
    ((AMPLS_MP__internal*)(slv->internal_info_))->msg_extra_.
      push_back(o.what());
    return 1;
  }
  catch (const std::runtime_error& e) {
    ((AMPLS_MP__internal*)(slv->internal_info_))->msg_extra_.
      push_back(e.what());
  }
  catch (const std::exception& ) {
  }
  return 2;
}